

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_six(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
           *this)

{
  size_type *psVar1;
  pointer pdVar2;
  pointer pVVar3;
  pointer pAVar4;
  size_type __n;
  unsigned_long *row;
  size_type *psVar5;
  value_type vVar6;
  reference rVar7;
  
  vVar6 = find_smallest(this);
  psVar1 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (psVar5 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    __n = *psVar5;
    pVVar3 = (this->graph_->vertices_).
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pAVar4 = *(pointer *)&((Adjacencies *)((long)(pVVar3 + __n) + 0x20))->vector_;
        pAVar4 != *(pointer *)((long)(pVVar3 + __n) + 0x28); pAVar4 = pAVar4 + 1) {
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->row_cover,__n);
      if ((*rVar7._M_p & rVar7._M_mask) != 0) {
        pdVar2 = (this->costs_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2[pAVar4->edge_] = pdVar2[pAVar4->edge_] + vVar6;
      }
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->col_cover,
                         pAVar4->vertex_ -
                         ((long)(this->rows_).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->rows_).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3));
      if ((*rVar7._M_p & rVar7._M_mask) == 0) {
        pdVar2 = (this->costs_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2[pAVar4->edge_] = pdVar2[pAVar4->edge_] - vVar6;
      }
      __n = *psVar5;
      pVVar3 = (this->graph_->vertices_).
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  this->step_ = FOUR;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_six()
{
    auto const& minval = find_smallest();
    for (auto const& row : rows_) {
        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it) {
            if (row_cover[row])
                costs_[it->edge()] += minval;
            if (!col_cover[col_of_idx(it->vertex())])
                costs_[it->edge()] -= minval;
        }
    }
    step_ = Step::FOUR;
}